

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O2

int __thiscall
CVmObjDate::getp_addInterval(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  vm_obj_id_t vVar4;
  int iVar5;
  undefined4 in_register_00000034;
  vm_val_t *this_00;
  long lVar6;
  double dVar7;
  double local_60;
  caldate_t cd;
  vm_val_t ele;
  
  if (oargc == (uint *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = (long)(int)*oargc;
  }
  if ((getp_addInterval(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_addInterval(unsigned_int,vm_val_t*,unsigned_int*)::desc,
                                  CONCAT44(in_register_00000034,self)), iVar1 != 0)) {
    getp_addInterval::desc.min_argc_ = 1;
    getp_addInterval::desc.opt_argc_ = 0;
    getp_addInterval::desc.varargs_ = 0;
    __cxa_guard_release(&getp_addInterval(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_addInterval::desc);
  if (iVar1 == 0) {
    this_00 = sp_ + -1;
    iVar1 = vm_val_t::is_listlike(this_00);
    if (iVar1 == 0) {
      err_throw(0x900);
    }
    iVar1 = 1;
    caldate_t::set_dayno(&cd,*(int32_t *)(this->super_CVmObject).ext_);
    local_60 = (double)*(int *)((this->super_CVmObject).ext_ + 4);
    iVar2 = vm_val_t::ll_length(this_00);
    iVar5 = 0;
    if (0 < iVar2) {
      iVar5 = iVar2;
    }
    for (; iVar1 - iVar5 != 1; iVar1 = iVar1 + 1) {
      vm_val_t::ll_index(this_00,&ele,iVar1);
      if (ele.typ == VM_NIL) goto switchD_0024934e_default;
      switch(iVar1) {
      case 1:
        iVar3 = vm_val_t::num_to_int(&ele);
        cd.y = cd.y + iVar3;
        break;
      case 2:
        iVar3 = vm_val_t::num_to_int(&ele);
        cd.m = cd.m + iVar3;
        break;
      case 3:
        iVar3 = vm_val_t::num_to_int(&ele);
        cd.d = cd.d + iVar3;
        break;
      case 4:
        dVar7 = vm_val_t::num_to_double(&ele);
        dVar7 = dVar7 * 60.0 * 60.0;
        goto LAB_002493ae;
      case 5:
        dVar7 = vm_val_t::num_to_double(&ele);
        dVar7 = dVar7 * 60.0;
        goto LAB_002493ae;
      case 6:
        dVar7 = vm_val_t::num_to_double(&ele);
LAB_002493ae:
        local_60 = local_60 + dVar7 * 1000.0;
      }
switchD_0024934e_default:
    }
    dVar7 = floor(local_60 / 86400000.0);
    if ((2147483647.0 < (double)cd.d + dVar7) || ((double)cd.d + dVar7 < -2147483648.0)) {
      err_throw(0x7e7);
    }
    cd.d = cd.d + (int)dVar7;
    iVar3 = caldate_t::dayno(&cd);
    vVar4 = create(0,iVar3,(int)(local_60 + dVar7 * -86400000.0));
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar4;
    sp_ = sp_ + -lVar6;
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_addInterval(VMG_ vm_obj_id_t self,
                                 vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the interval list */
    vm_val_t *lst = G_stk->get(0);
    if (!lst->is_listlike(vmg0_))
        err_throw(VMERR_BAD_TYPE_BIF);

    /* retrieve my date as a calendar object */
    int32_t dayno = get_ext()->dayno;
    caldate_t cd(dayno);

    /* retrieve my time as a double, to allow for overflows from int32 */
    double daytime = get_ext()->daytime;

    /* add each element from the list */
    int cnt = lst->ll_length(vmg0_);
    for (int i = 1 ; i <= cnt ; ++i)
    {
        /* get this interval element */
        vm_val_t ele;
        lst->ll_index(vmg_ &ele, i);

        /* treat nil as zero */
        if (ele.typ == VM_NIL)
            continue;

        /* add it to the appropriate date or time component */
        switch (i)
        {
        case 1: cd.y += ele.num_to_int(vmg0_); break;
        case 2: cd.m += ele.num_to_int(vmg0_); break;
        case 3: cd.d += ele.num_to_int(vmg0_); break;

        case 4: daytime += ele.num_to_double(vmg0_)*60.*60.*1000.; break;
        case 5: daytime += ele.num_to_double(vmg0_)*60.*1000.; break;
        case 6: daytime += ele.num_to_double(vmg0_)*1000.; break;
        }
    }

    /* carry overflows from the time into the day */
    double day_carry = floor(daytime / (24.*60.*60.*1000.));
    daytime -= day_carry * (24.*60.*60.*1000.);

    if (day_carry + cd.d > INT32MAXVAL || day_carry + cd.d < INT32MINVAL)
        err_throw(VMERR_NUM_OVERFLOW);

    cd.d += (int32_t)day_carry;

    /* return the new date, using our same local timezone */
    retval->set_obj(create(vmg_ FALSE, cd.dayno(), (int32_t)daytime));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}